

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int uv__udp_init_ex(uv_loop_t *loop,uv_udp_t *handle,uint flags,int domain)

{
  uv__queue *puVar1;
  int fd;
  
  if (domain == 0) {
    fd = -1;
  }
  else {
    fd = uv__socket(domain,2,0);
    if (fd < 0) {
      return fd;
    }
  }
  handle->loop = loop;
  handle->type = UV_UDP;
  handle->flags = 8;
  (handle->handle_queue).next = &loop->handle_queue;
  puVar1 = (loop->handle_queue).prev;
  (handle->handle_queue).prev = puVar1;
  puVar1->next = &handle->handle_queue;
  (loop->handle_queue).prev = &handle->handle_queue;
  handle->next_closing = (uv_handle_t *)0x0;
  handle->send_queue_size = 0;
  handle->send_queue_count = 0;
  handle->alloc_cb = (uv_alloc_cb)0x0;
  handle->recv_cb = (uv_udp_recv_cb)0x0;
  uv__io_init(&handle->io_watcher,uv__udp_io,fd);
  (handle->write_queue).next = &handle->write_queue;
  (handle->write_queue).prev = &handle->write_queue;
  (handle->write_completed_queue).next = &handle->write_completed_queue;
  (handle->write_completed_queue).prev = &handle->write_completed_queue;
  return 0;
}

Assistant:

int uv__udp_init_ex(uv_loop_t* loop,
                    uv_udp_t* handle,
                    unsigned flags,
                    int domain) {
  int fd;

  fd = -1;
  if (domain != AF_UNSPEC) {
    fd = uv__socket(domain, SOCK_DGRAM, 0);
    if (fd < 0)
      return fd;
  }

  uv__handle_init(loop, (uv_handle_t*)handle, UV_UDP);
  handle->alloc_cb = NULL;
  handle->recv_cb = NULL;
  handle->send_queue_size = 0;
  handle->send_queue_count = 0;
  uv__io_init(&handle->io_watcher, uv__udp_io, fd);
  uv__queue_init(&handle->write_queue);
  uv__queue_init(&handle->write_completed_queue);

  return 0;
}